

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O1

value_type * __thiscall
(anonymous_namespace)::
serialize_and_visit<(anonymous_namespace)::ToString,std::vector<int,std::allocator<int>>>
          (value_type *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<int,_std::allocator<int>_> *in)

{
  uint *puVar1;
  long lVar2;
  cx_string<2UL> cVar3;
  string_view full_tag;
  string_view tag_00;
  cx_string<2UL> tag;
  InputStream istream;
  OutputStream ostream;
  ToString visitor;
  stringstream stream;
  cx_string<1UL> local_350;
  cx_string<1UL> local_34e;
  undefined2 local_34c;
  char local_34a;
  InputStream local_348;
  OutputStream local_340;
  stringstream local_338 [16];
  long local_328;
  uint auStack_310 [22];
  ios_base aiStack_2b8 [264];
  long local_1b0 [3];
  undefined4 auStack_194 [25];
  ios_base aiStack_130 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  lVar2 = *(long *)(local_1b0[0] + -0x18);
  *(undefined4 *)((long)auStack_194 + lVar2) = 4;
  std::ios::clear((int)local_338 + (int)lVar2 + 0x188);
  local_340.stream = (stringstream *)local_1b0;
  mserialize::detail::BuiltinSerializer<std::vector<int,_std::allocator<int>_>,_void>::
  serialize<OutputStream>((vector<int,_std::allocator<int>_> *)this,&local_340);
  std::__cxx11::stringstream::stringstream(local_338);
  puVar1 = (uint *)((long)auStack_310 + *(long *)(local_328 + -0x18));
  *puVar1 = *puVar1 | 1;
  local_34e._data[0] = '[';
  local_34e._data[1] = '\0';
  local_350._data[0] = 'i';
  local_350._data[1] = '\0';
  local_348.stream = (stringstream *)local_1b0;
  cVar3 = mserialize::cx_strcat<1ul,1ul>(&local_34e,&local_350);
  local_34c = cVar3._data._0_2_;
  local_34a = cVar3._data[2];
  full_tag._len = 2;
  full_tag._ptr = (char *)&local_34c;
  tag_00._len = 2;
  tag_00._ptr = (char *)&local_34c;
  mserialize::detail::visit_impl<(anonymous_namespace)::ToString,InputStream>
            (full_tag,tag_00,(ToString *)local_338,&local_348,0x800);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_338);
  std::ios_base::~ios_base(aiStack_2b8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(aiStack_130);
  return __return_storage_ptr__;
}

Assistant:

typename Visitor::value_type
serialize_and_visit(const T& in)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // visit
  Visitor visitor;
  InputStream istream{stream};
  const auto tag = mserialize::tag<T>();
  mserialize::visit(tag, visitor, istream);

  return visitor.value();
}